

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optimizer.cpp
# Opt level: O3

void __thiscall
calc4::anon_unknown_23::PrecomputeVisitor<int>::Visit
          (PrecomputeVisitor<int> *this,shared_ptr<const_calc4::UserDefinedOperator> *op)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  operands;
  undefined1 local_89;
  shared_ptr<const_calc4::Operator> local_88;
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  local_78;
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  local_58;
  shared_ptr<const_calc4::UserDefinedOperator> *local_38;
  
  local_58.
  super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = op;
  (*(((op->super___shared_ptr<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ->super_Operator)._vptr_Operator[1])(&local_78);
  psVar1 = local_78.
           super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_78.
      super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_78.
             super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      (**(code **)*p_Var2->_vptr__Sp_counted_base)(p_Var2->_vptr__Sp_counted_base,this);
      local_88.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_88.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (local_88.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_88.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_88.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_88.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_88.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      std::
      vector<std::shared_ptr<calc4::Operator_const>,std::allocator<std::shared_ptr<calc4::Operator_const>>>
      ::emplace_back<std::shared_ptr<calc4::Operator_const>>
                ((vector<std::shared_ptr<calc4::Operator_const>,std::allocator<std::shared_ptr<calc4::Operator_const>>>
                  *)&local_58,&local_88);
      if (local_88.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      p_Var2 = p_Var2 + 1;
    } while (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar1);
  }
  std::
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ::~vector(&local_78);
  local_88.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       ((ulong)local_88.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       & 0xffffffffffff0000);
  std::
  __shared_ptr<calc4::UserDefinedOperator::AllocateHelper<calc4::UserDefinedOperator>::Object,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<std::allocator<calc4::UserDefinedOperator::AllocateHelper<calc4::UserDefinedOperator>::Object>,calc4::OperatorDefinition_const&,std::vector<std::shared_ptr<calc4::Operator_const>,std::allocator<std::shared_ptr<calc4::Operator_const>>>const&,std::optional<bool>&>
            ((__shared_ptr<calc4::UserDefinedOperator::AllocateHelper<calc4::UserDefinedOperator>::Object,(__gnu_cxx::_Lock_policy)2>
              *)&local_78,
             (allocator<calc4::UserDefinedOperator::AllocateHelper<calc4::UserDefinedOperator>::Object>
              *)&local_89,
             &((local_38->
               super___shared_ptr<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->definition,&local_58,(optional<bool> *)&local_88);
  p_Var2 = (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_78.
       super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_78.
          super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  std::
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const UserDefinedOperator>& op) override
    {
        std::vector<std::shared_ptr<const Operator>> operands;

        for (auto& op2 : op->GetOperands())
        {
            operands.push_back(Precompute(op2));
        }

        value = UserDefinedOperator::Create(op->GetDefinition(), std::move(operands));
    }